

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O3

void gostcrypt(gost_ctx *c,byte *in,byte *out)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar1 = c->mask[0] + c->key[0];
  uVar2 = iVar1 + *(uint *)in;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ *(uint *)(in + 4);
  iVar6 = c->mask[1] + c->key[1];
  uVar2 = iVar6 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  iVar5 = c->mask[2] + c->key[2];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ *(uint *)in;
  uVar2 = iVar5 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  iVar7 = c->mask[3] + c->key[3];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar7 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  iVar9 = c->mask[4] + c->key[4];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar9 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  iVar4 = c->mask[5] + c->key[5];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar4 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  iVar10 = c->mask[6] + c->key[6];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar10 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  iVar11 = c->mask[7] + c->key[7];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar11 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar1 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar6 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar5 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar7 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar9 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar4 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar10 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar11 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar1 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar6 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar5 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar7 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar9 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar4 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar10 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar11 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar11 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar10 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar4 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar9 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar7 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar5 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  uVar2 = iVar6 + uVar3;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar8 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar8;
  uVar2 = iVar1 + uVar8;
  uVar2 = *(uint *)((long)c->k65 + (ulong)(uVar2 >> 0xe & 0x3fc)) | c->k87[uVar2 >> 0x18] |
          c->k43[uVar2 >> 8 & 0xff] | c->k21[uVar2 & 0xff];
  uVar3 = (uVar2 << 0xb | uVar2 >> 0x15) ^ uVar3;
  *out = (byte)uVar8;
  out[1] = (byte)(uVar8 >> 8);
  out[2] = (byte)(uVar8 >> 0x10);
  out[3] = (byte)(uVar8 >> 0x18);
  out[4] = (byte)uVar3;
  out[5] = (byte)(uVar3 >> 8);
  out[6] = (byte)(uVar3 >> 0x10);
  out[7] = (byte)(uVar3 >> 0x18);
  return;
}

Assistant:

void gostcrypt(gost_ctx * c, const byte * in, byte * out)
{
    register word32 n1, n2;     /* As named in the GOST */
    n1 = in[0] | (in[1] << 8) | (in[2] << 16) | ((word32) in[3] << 24);
    n2 = in[4] | (in[5] << 8) | (in[6] << 16) | ((word32) in[7] << 24);
    /* Instead of swapping halves, swap names each round */

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[7] + c->mask[7]);
    n1 ^= f(c, n2 + c->key[6] + c->mask[6]);
    n2 ^= f(c, n1 + c->key[5] + c->mask[5]);
    n1 ^= f(c, n2 + c->key[4] + c->mask[4]);
    n2 ^= f(c, n1 + c->key[3] + c->mask[3]);
    n1 ^= f(c, n2 + c->key[2] + c->mask[2]);
    n2 ^= f(c, n1 + c->key[1] + c->mask[1]);
    n1 ^= f(c, n2 + c->key[0] + c->mask[0]);

    out[0] = (byte) (n2 & 0xff);
    out[1] = (byte) ((n2 >> 8) & 0xff);
    out[2] = (byte) ((n2 >> 16) & 0xff);
    out[3] = (byte) (n2 >> 24);
    out[4] = (byte) (n1 & 0xff);
    out[5] = (byte) ((n1 >> 8) & 0xff);
    out[6] = (byte) ((n1 >> 16) & 0xff);
    out[7] = (byte) (n1 >> 24);
}